

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void RemoveEmptyHistograms(VP8LHistogramSet *image_histo)

{
  VP8LHistogram *pVVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)image_histo->size;
  if (image_histo->size < 1) {
    uVar2 = uVar3;
  }
  uVar4 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pVVar1 = image_histo->histograms[uVar3];
    uVar5 = uVar4;
    if (pVVar1 != (VP8LHistogram *)0x0) {
      uVar5 = (ulong)((int)uVar4 + 1);
      image_histo->histograms[uVar4] = pVVar1;
    }
    uVar4 = uVar5;
  }
  image_histo->size = (int)uVar4;
  return;
}

Assistant:

static void RemoveEmptyHistograms(VP8LHistogramSet* const image_histo) {
  uint32_t size;
  int i;
  for (i = 0, size = 0; i < image_histo->size; ++i) {
    if (image_histo->histograms[i] == NULL) continue;
    image_histo->histograms[size++] = image_histo->histograms[i];
  }
  image_histo->size = size;
}